

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

double asl::myatof(char *s)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  byte *__s;
  int iVar10;
  double dVar11;
  
  cVar1 = *s;
  __s = (byte *)(s + (cVar1 == '-'));
  pcVar6 = strchr((char *)__s,0x2e);
  if (pcVar6 == (char *)0x0) {
    iVar10 = 0;
    pbVar7 = (byte *)0x0;
  }
  else {
    for (lVar9 = 0; ((cVar2 = pcVar6[lVar9 + 1], cVar2 != '\0' && (cVar2 != 'E')) && (cVar2 != 'e'))
        ; lVar9 = lVar9 + 1) {
    }
    iVar10 = -(int)lVar9;
    pbVar7 = (byte *)(pcVar6 + lVar9);
  }
  if (pbVar7 == (byte *)0x0) {
    pbVar7 = __s;
  }
  do {
    pbVar8 = pbVar7;
    if (*pbVar8 == 0) goto LAB_0011b2e5;
    pbVar7 = pbVar8 + 1;
  } while ((pbVar8[1] | 0x20) != 0x65);
  iVar5 = myatoiz((char *)(pbVar8 + 1 + (ulong)(pbVar8[2] == 0x2b) + 1));
  iVar10 = iVar5 + iVar10;
LAB_0011b2e5:
  lVar9 = 0;
  do {
    bVar3 = *__s;
    bVar4 = true;
    if (bVar3 != 0) {
      if (bVar3 != 0x2e) {
        if ((bVar3 & 0xdf) == 0x45) goto LAB_0011b312;
        lVar9 = (long)(char)bVar3 + lVar9 * 10 + -0x30;
      }
      bVar4 = false;
    }
LAB_0011b312:
    __s = __s + 1;
    if (bVar4) {
      dVar11 = pow(10.0,(double)iVar10);
      dVar11 = (double)lVar9 * dVar11;
      if (cVar1 == '-') {
        dVar11 = -dVar11;
      }
      return dVar11;
    }
  } while( true );
}

Assistant:

double myatof(const char* s)
{
	double y = 0;
	double m = 1;
	int exp = 0;
	if (s[0] == '-') { m = -1; s++; }
	const char* p = strchr(s, '.');
	if (p) {
		p++;
		while (*p != '\0' && *p != 'e' && *p != 'E') {
			exp--;
			p++;
		}
		p--;
	}
	if (!p) p = s;
	while (*p++)
		if (*p == 'e' || *p == 'E'){
			if (*(p + 1) == '+')
				p++;
			exp += myatoiz(p + 1);
			break;
		}
	long long y1 = 0;
	while (int c = *s++)
	{
		if (c == '.') continue;
		if (c == 'E' || c == 'e') break;
		y1 = 10 * y1 + (c - '0');
	}
	y = double(y1) * pow(10.0, exp);
	return y * m;
}